

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::paramCheckFixStorage
          (TParseContext *this,TSourceLoc *loc,TStorageQualifier *qualifier,TType *type)

{
  TStorageQualifier TVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar4;
  ulong uVar5;
  long lVar3;
  
  TVar1 = *qualifier;
  if ((ulong)TVar1 < 0x20) {
    if ((0x80070000U >> (TVar1 & EvqTileImageEXT) & 1) == 0) {
      if ((3U >> (TVar1 & EvqTileImageEXT) & 1) == 0) {
        if ((0x80004U >> (TVar1 & EvqTileImageEXT) & 1) == 0) goto LAB_003a7c4f;
        iVar2 = (*type->_vptr_TType[10])(type);
        lVar3 = CONCAT44(extraout_var,iVar2);
        uVar5 = *(ulong *)(lVar3 + 8) & 0xffffffffffffff80 | 0x13;
      }
      else {
        iVar2 = (*type->_vptr_TType[10])(type);
        lVar3 = CONCAT44(extraout_var_01,iVar2);
        uVar5 = *(ulong *)(lVar3 + 8) & 0xffffffffffffff80 | 0x10;
      }
    }
    else {
      iVar2 = (*type->_vptr_TType[10])(type);
      lVar3 = CONCAT44(extraout_var_00,iVar2);
      uVar5 = *(ulong *)(lVar3 + 8) & 0xffffffffffffff80 | (ulong)TVar1;
    }
    *(ulong *)(lVar3 + 8) = uVar5;
    return;
  }
LAB_003a7c4f:
  iVar2 = (*type->_vptr_TType[10])(type);
  *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) =
       *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) & 0xffffffffffffff80 | 0x10;
  pcVar4 = GetStorageQualifierString(*qualifier);
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)
            (this,loc,"storage qualifier not allowed on function parameter",pcVar4,"",
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::paramCheckFixStorage(const TSourceLoc& loc, const TStorageQualifier& qualifier, TType& type)
{
    switch (qualifier) {
    case EvqConst:
    case EvqConstReadOnly:
        type.getQualifier().storage = EvqConstReadOnly;
        break;
    case EvqIn:
    case EvqOut:
    case EvqInOut:
    case EvqTileImageEXT:
        type.getQualifier().storage = qualifier;
        break;
    case EvqGlobal:
    case EvqTemporary:
        type.getQualifier().storage = EvqIn;
        break;
    default:
        type.getQualifier().storage = EvqIn;
        error(loc, "storage qualifier not allowed on function parameter", GetStorageQualifierString(qualifier), "");
        break;
    }
}